

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

Var Js::JavascriptOperators::PatchGetPropertyScoped<true,Js::InlineCache>
              (FunctionBody *functionBody,InlineCache *inlineCache,InlineCacheIndex inlineCacheIndex
              ,FrameDisplay *pDisplay,PropertyId propertyId,Var defaultInstance)

{
  ushort uVar1;
  bool bVar2;
  BOOL BVar3;
  ModuleID moduleID;
  ScriptContext *requestContext;
  void *aValue;
  RecyclableObject *pRVar4;
  DynamicObject *object;
  Var pvVar5;
  int32 hCode;
  uint index;
  undefined1 local_a8 [8];
  PropertyValueInfo info;
  UndeclaredBlockVariable *local_40;
  Var value;
  
  value._4_4_ = inlineCacheIndex;
  requestContext = FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
  uVar1 = pDisplay->length;
  local_a8 = (undefined1  [8])0x0;
  info.m_instance = (RecyclableObject *)0x50000ffff;
  info.m_propertyIndex = 0;
  info.m_attributes = '\0';
  info.flags = InlineCacheNoFlags;
  info.cacheInfoFlag = 0;
  info.inlineCache = (InlineCache *)0x0;
  info.polymorphicInlineCache = (PolymorphicInlineCache *)0x0;
  info.functionBody = (FunctionBody *)0x0;
  info.prop = (RecyclableObject *)0x0;
  info.propertyRecordUsageCache._0_4_ = 0xffffffff;
  info.propertyRecordUsageCache._5_1_ = 1;
  index = 0;
  info._56_8_ = pDisplay;
  PropertyValueInfo::SetCacheInfo
            ((PropertyValueInfo *)local_a8,functionBody,inlineCache,value._4_4_,false);
  do {
    if (uVar1 == index) {
      if (propertyId == 0x2d5) {
        pRVar4 = (((requestContext->super_ScriptContextBase).javascriptLibrary)->
                 super_JavascriptLibraryBase).nullValue.ptr;
        moduleID = FunctionBody::GetModuleID(functionBody);
        pvVar5 = OP_GetThis(pRVar4,moduleID,&requestContext->super_ScriptContextInfo);
        return pvVar5;
      }
      if (propertyId == 0x2d6) {
        hCode = -0x7ff5ebe7;
      }
      else {
        object = VarTo<Js::DynamicObject>(defaultInstance);
        local_40 = (UndeclaredBlockVariable *)
                   PatchGetRootValue<true,Js::InlineCache>
                             (functionBody,inlineCache,value._4_4_,object,propertyId);
LAB_009bdbd7:
        if ((((requestContext->super_ScriptContextBase).javascriptLibrary)->undeclBlockVarSentinel).
            ptr != local_40) {
          return local_40;
        }
        hCode = -0x7ff5ec07;
      }
      JavascriptError::ThrowReferenceError(requestContext,hCode,(PCWSTR)0x0);
    }
    aValue = FrameDisplay::GetItem((FrameDisplay *)info._56_8_,index);
    pRVar4 = UnsafeVarTo<Js::RecyclableObject>(aValue);
    bVar2 = CacheOperators::TryGetProperty<true,true,true,false,true,true,true,false,false,false>
                      (pRVar4,false,pRVar4,propertyId,&local_40,requestContext,
                       (PropertyCacheOperationInfo *)0x0,(PropertyValueInfo *)local_a8);
    if (bVar2) {
      return local_40;
    }
    bVar2 = Phases::IsEnabled((Phases *)&DAT_01453738,InlineCachePhase);
    if ((bVar2) && (DAT_0145948a == '\x01')) {
      CacheOperators::TraceCache
                (inlineCache,L"PatchGetPropertyScoped",propertyId,requestContext,pRVar4);
    }
    BVar3 = GetProperty(pRVar4,propertyId,&local_40,requestContext,(PropertyValueInfo *)local_a8);
    if (BVar3 != 0) {
      if (propertyId == 0x2d5) {
        return local_40;
      }
      goto LAB_009bdbd7;
    }
    index = index + 1;
  } while( true );
}

Assistant:

inline Var JavascriptOperators::PatchGetPropertyScoped(FunctionBody *const functionBody, TInlineCache *const inlineCache, const InlineCacheIndex inlineCacheIndex, FrameDisplay *pDisplay, PropertyId propertyId, Var defaultInstance)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_PatchGetPropertyScoped);
        // Get the property, using a scope stack rather than an individual instance.
        // Walk the stack until we find an instance that has the property.

        ScriptContext *const scriptContext = functionBody->GetScriptContext();
        uint16 length = pDisplay->GetLength();

        PropertyValueInfo info;
        PropertyValueInfo::SetCacheInfo(&info, functionBody, inlineCache, inlineCacheIndex, !IsFromFullJit);
        for (uint16 i = 0; i < length; i++)
        {
            RecyclableObject* object = UnsafeVarTo<RecyclableObject>(pDisplay->GetItem(i));

            Var value;
            if (CacheOperators::TryGetProperty<true, true, true, false, true, true, !TInlineCache::IsPolymorphic, TInlineCache::IsPolymorphic, false, false>(
                    object, false, object, propertyId, &value, scriptContext, nullptr, &info))
            {
                return value;
            }

#if DBG_DUMP
            if (PHASE_VERBOSE_TRACE1(Js::InlineCachePhase))
            {
                CacheOperators::TraceCache(inlineCache, _u("PatchGetPropertyScoped"), propertyId, scriptContext, object);
            }
#endif
            if (JavascriptOperators::GetProperty(object, propertyId, &value, scriptContext, &info))
            {
                if (scriptContext->IsUndeclBlockVar(value) && propertyId != PropertyIds::_this)
                {
                    JavascriptError::ThrowReferenceError(scriptContext, JSERR_UseBeforeDeclaration);
                }
                return value;
            }
        }

        // There is no root decl for 'this', we should instead load the global 'this' value.
        if (propertyId == PropertyIds::_this)
        {
            Var varNull = OP_LdNull(scriptContext);
            return JavascriptOperators::OP_GetThis(varNull, functionBody->GetModuleID(), scriptContext);
        }
        else if (propertyId == PropertyIds::_super)
        {
            JavascriptError::ThrowReferenceError(scriptContext, JSERR_BadSuperReference);
        }

        // No one in the scope stack has the property, so get it from the default instance provided by the caller.
        Var value = JavascriptOperators::PatchGetRootValue<IsFromFullJit>(functionBody, inlineCache, inlineCacheIndex, VarTo<DynamicObject>(defaultInstance), propertyId);
        if (scriptContext->IsUndeclBlockVar(value))
        {
            JavascriptError::ThrowReferenceError(scriptContext, JSERR_UseBeforeDeclaration);
        }
        return value;
        JIT_HELPER_END(Op_PatchGetPropertyScoped);
    }